

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-interface.c
# Opt level: O2

int run_test_udp_multicast_interface(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b;
  undefined8 local_178;
  sockaddr_in baddr;
  sockaddr_in addr;
  uv_udp_send_t req;
  
  iVar1 = uv_ip4_addr("239.255.0.1",0x23a3,&addr);
  req.data = (void *)(long)iVar1;
  eval_b = 0;
  if (req.data == (void *)0x0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_udp_init(uVar2,&server);
    req.data = (void *)(long)iVar1;
    eval_b = 0;
    if (req.data == (void *)0x0) {
      iVar1 = uv_ip4_addr("0.0.0.0",0,&baddr);
      req.data = (void *)(long)iVar1;
      eval_b = 0;
      if (req.data == (void *)0x0) {
        iVar1 = uv_udp_bind(&server,&baddr,0);
        req.data = (void *)(long)iVar1;
        eval_b = 0;
        if (req.data == (void *)0x0) {
          iVar1 = uv_udp_set_multicast_interface(&server,"0.0.0.0");
          req.data = (void *)(long)iVar1;
          eval_b = 0;
          if (req.data == (void *)0x0) {
            auVar5 = uv_buf_init("PING",4);
            local_178 = auVar5._8_8_;
            eval_b = auVar5._0_8_;
            iVar1 = uv_udp_send(&req,&server,&eval_b,1,&addr,sv_send_cb);
            eval_a_5 = (int64_t)iVar1;
            eval_b_5 = 0;
            if ((void *)eval_a_5 == (void *)0x0) {
              eval_a_5 = (int64_t)close_cb_called;
              eval_b_5 = 0;
              if ((void *)eval_a_5 == (void *)0x0) {
                eval_a_5 = (int64_t)sv_send_cb_called;
                eval_b_5 = 0;
                if ((void *)eval_a_5 == (void *)0x0) {
                  uVar2 = uv_default_loop();
                  uv_run(uVar2,0);
                  eval_a_5 = 1;
                  eval_b_5 = (int64_t)sv_send_cb_called;
                  if (eval_b_5 == 1) {
                    eval_a_5 = 1;
                    eval_b_5 = (int64_t)close_cb_called;
                    if (eval_b_5 == 1) {
                      eval_b_5 = 0;
                      if (server.send_queue_size == 0) {
                        uVar2 = uv_default_loop();
                        uv_walk(uVar2,close_walk_cb,0);
                        uv_run(uVar2,0);
                        eval_a_5 = 0;
                        uVar2 = uv_default_loop();
                        iVar1 = uv_loop_close(uVar2);
                        eval_b_5 = (int64_t)iVar1;
                        if (eval_b_5 == 0) {
                          uv_library_shutdown();
                          return 0;
                        }
                        pcVar4 = "uv_loop_close(uv_default_loop())";
                        pcVar3 = "0";
                        uVar2 = 0x66;
                      }
                      else {
                        pcVar4 = "0";
                        pcVar3 = "server.send_queue_size";
                        uVar2 = 100;
                        eval_a_5 = server.send_queue_size;
                      }
                    }
                    else {
                      pcVar4 = "close_cb_called";
                      pcVar3 = "1";
                      uVar2 = 0x61;
                    }
                  }
                  else {
                    pcVar4 = "sv_send_cb_called";
                    pcVar3 = "1";
                    uVar2 = 0x60;
                  }
                }
                else {
                  pcVar4 = "0";
                  pcVar3 = "sv_send_cb_called";
                  uVar2 = 0x5b;
                }
              }
              else {
                pcVar4 = "0";
                pcVar3 = "close_cb_called";
                uVar2 = 0x5a;
              }
            }
            else {
              pcVar4 = "0";
              pcVar3 = "r";
              uVar2 = 0x58;
            }
            goto LAB_001a6e1a;
          }
          pcVar3 = "r";
          uVar2 = 0x4e;
        }
        else {
          pcVar3 = "r";
          uVar2 = 0x4b;
        }
      }
      else {
        pcVar3 = "uv_ip4_addr(\"0.0.0.0\", 0, &baddr)";
        uVar2 = 0x49;
      }
    }
    else {
      pcVar3 = "r";
      uVar2 = 0x47;
    }
  }
  else {
    pcVar3 = "uv_ip4_addr(\"239.255.0.1\", 9123, &addr)";
    uVar2 = 0x44;
  }
  eval_b = 0;
  pcVar4 = "0";
  eval_b_5 = 0;
  eval_a_5 = (int64_t)req.data;
LAB_001a6e1a:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-interface.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a_5,"==",eval_b_5);
  abort();
}

Assistant:

TEST_IMPL(udp_multicast_interface) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif

  int r;
  uv_udp_send_t req;
  uv_buf_t buf;
  struct sockaddr_in addr;
  struct sockaddr_in baddr;

  ASSERT_OK(uv_ip4_addr("239.255.0.1", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT_OK(r);

  ASSERT_OK(uv_ip4_addr("0.0.0.0", 0, &baddr));
  r = uv_udp_bind(&server, (const struct sockaddr*)&baddr, 0);
  ASSERT_OK(r);

  r = uv_udp_set_multicast_interface(&server, "0.0.0.0");
  ASSERT_OK(r);

  /* server sends "PING" */
  buf = uv_buf_init("PING", 4);
  r = uv_udp_send(&req,
                  &server,
                  &buf,
                  1,
                  (const struct sockaddr*)&addr,
                  sv_send_cb);
  ASSERT_OK(r);

  ASSERT_OK(close_cb_called);
  ASSERT_OK(sv_send_cb_called);

  /* run the loop till all events are processed */
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, sv_send_cb_called);
  ASSERT_EQ(1, close_cb_called);

  ASSERT_OK(client.send_queue_size);
  ASSERT_OK(server.send_queue_size);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}